

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_19bb9b::SharedLibraryShellCommand::executeExternalCommand
          (SharedLibraryShellCommand *this,BuildSystem *param_1,TaskInterface ti,
          QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  ProcessAttributes attributes;
  StringRef *pSVar1;
  long lVar2;
  ArrayRef<llvm::StringRef> commandLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char *local_108;
  char acStack_100 [8];
  code *local_f8;
  undefined8 uStack_f0;
  undefined1 local_e0 [16];
  code *local_d0;
  char acStack_c8 [8];
  bool local_c0;
  TaskInterface local_b8;
  undefined2 local_a8;
  undefined6 uStack_a6;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  StringRef *local_88;
  long lStack_80;
  long local_78;
  undefined1 local_68 [24];
  code *local_50;
  bool local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  local_b8.ctx = ti.ctx;
  local_b8.impl = ti.impl;
  (anonymous_namespace)::SharedLibraryShellCommand::getArgs_abi_cxx11_(&local_40,this);
  local_88 = (StringRef *)0x0;
  lStack_80 = 0;
  local_78 = 0;
  std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&local_88,
             local_40.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_40.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pSVar1 = local_88;
  lVar2 = lStack_80 - (long)local_88;
  local_a8 = 1;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0x101;
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::OptionalStorage((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
                    local_e0,&completionFn->Storage);
  local_f8 = (code *)0x0;
  uStack_f0 = 0;
  local_108 = (char *)0x0;
  acStack_100[0] = '\0';
  acStack_100[1] = '\0';
  acStack_100[2] = '\0';
  acStack_100[3] = '\0';
  acStack_100[4] = '\0';
  acStack_100[5] = '\0';
  acStack_100[6] = '\0';
  acStack_100[7] = '\0';
  local_108 = (char *)operator_new(0x28);
  local_108[0x20] = local_c0;
  if (local_c0 == true) {
    local_108[0] = '\0';
    local_108[1] = '\0';
    local_108[2] = '\0';
    local_108[3] = '\0';
    local_108[4] = '\0';
    local_108[5] = '\0';
    local_108[6] = '\0';
    local_108[7] = '\0';
    local_108[8] = '\0';
    local_108[9] = '\0';
    local_108[10] = '\0';
    local_108[0xb] = '\0';
    local_108[0xc] = '\0';
    local_108[0xd] = '\0';
    local_108[0xe] = '\0';
    local_108[0xf] = '\0';
    local_108[0x10] = '\0';
    local_108[0x11] = '\0';
    local_108[0x12] = '\0';
    local_108[0x13] = '\0';
    local_108[0x14] = '\0';
    local_108[0x15] = '\0';
    local_108[0x16] = '\0';
    local_108[0x17] = '\0';
    *(char (*) [8])(local_108 + 0x18) = acStack_c8;
    if (local_d0 != (code *)0x0) {
      *(undefined8 *)local_108 = local_e0._0_8_;
      *(undefined8 *)(local_108 + 8) = local_e0._8_8_;
      *(code **)(local_108 + 0x10) = local_d0;
      local_d0 = (code *)0x0;
      acStack_c8[0] = '\0';
      acStack_c8[1] = '\0';
      acStack_c8[2] = '\0';
      acStack_c8[3] = '\0';
      acStack_c8[4] = '\0';
      acStack_c8[5] = '\0';
      acStack_c8[6] = '\0';
      acStack_c8[7] = '\0';
    }
  }
  local_48 = true;
  local_50 = std::
             _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3620:18)>
             ::_M_invoke;
  local_68[8] = acStack_100[0];
  local_68[9] = acStack_100[1];
  local_68[10] = acStack_100[2];
  local_68[0xb] = acStack_100[3];
  local_68[0xc] = acStack_100[4];
  local_68[0xd] = acStack_100[5];
  local_68[0xe] = acStack_100[6];
  local_68[0xf] = acStack_100[7];
  local_68._16_8_ =
       std::
       _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp:3620:18)>
       ::_M_manager;
  local_f8 = (code *)0x0;
  uStack_f0 = 0;
  attributes._2_6_ = uStack_a6;
  attributes.canSafelyInterrupt = (bool)(undefined1)local_a8;
  attributes.connectToConsole = (bool)local_a8._1_1_;
  attributes._26_6_ = uStack_8e;
  attributes.inheritEnvironment = (bool)(undefined1)uStack_90;
  attributes.controlEnabled = (bool)uStack_90._1_1_;
  attributes.workingDir.Data = (char *)uStack_a0;
  attributes.workingDir.Length = uStack_98;
  commandLine.Length = lVar2 >> 4;
  commandLine.Data = pSVar1;
  local_68._0_8_ = local_108;
  llbuild::core::TaskInterface::spawn
            (&local_b8,context,commandLine,
             (ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_>)ZEXT816(0),attributes,
             (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)local_68,
             (ProcessDelegate *)0x0);
  if (local_48 == true) {
    if ((code *)local_68._16_8_ != (code *)0x0) {
      (*(code *)local_68._16_8_)(local_68,local_68,3);
    }
    local_48 = false;
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,3);
  }
  if (local_c0 == true) {
    if (local_d0 != (code *)0x0) {
      (*local_d0)(local_e0,local_e0,3);
    }
    local_c0 = false;
  }
  if (local_88 != (StringRef *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  return;
}

Assistant:

virtual void executeExternalCommand(
      BuildSystem&, TaskInterface ti, QueueJobContext* context,
      llvm::Optional<ProcessCompletionFn> completionFn) override {

    auto args = getArgs();
    ti.spawn(
        context, std::vector<StringRef>(args.begin(), args.end()), {},
        {true}, {[completionFn](ProcessResult result) {
          if (completionFn.hasValue())
            completionFn.getValue()(result);
        }});
  }